

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void LiteScript::StateExecutor::I_DEFINE_RETURN(State *state,Instruction *instr)

{
  pointer pVVar1;
  Nullable<LiteScript::Variable> local_30;
  
  state->line_num = state->line_num + 1;
  pVVar1 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar1 != (state->op_lifo).
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                _M_impl.super__Vector_impl_data._M_start) {
    local_30.isNull = &local_30.is_null;
    local_30.is_null = false;
    Variable::Variable((Variable *)&local_30,pVVar1 + -1);
    Nullable<LiteScript::Variable>::operator=
              ((state->rets).
               super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,&local_30);
    if (local_30.is_null == false) {
      Variable::~Variable((Variable *)&local_30);
    }
    PopValue(state);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_DEFINE_RETURN(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() == 0)
        return;
    state.rets.back() = Nullable<Variable>(state.op_lifo.back());
    PopValue(state);
}